

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlite_context_throw_error_format(unqlite_context *pCtx,int iErr,char *zFormat,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [24];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined1 local_48 [4];
  int rc;
  va_list ap;
  char *zFormat_local;
  int iErr_local;
  unqlite_context *pCtx_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  if (zFormat == (char *)0x0) {
    pCtx_local._4_4_ = 0;
  }
  else {
    ap[0].overflow_arg_area = local_108;
    ap[0]._0_8_ = &stack0x00000008;
    rc = 0x30;
    local_48 = (undefined1  [4])0x18;
    local_f0 = in_RCX;
    local_e8 = in_R8;
    local_e0 = in_R9;
    pCtx_local._4_4_ =
         jx9VmThrowErrorAp(pCtx->pVm,&pCtx->pFunc->sName,iErr,zFormat,(__va_list_tag *)local_48);
  }
  return pCtx_local._4_4_;
}

Assistant:

int unqlite_context_throw_error_format(unqlite_context *pCtx, int iErr, const char *zFormat, ...)
{
	va_list ap;
	int rc;
	if( zFormat == 0){
		return JX9_OK;
	}
	va_start(ap, zFormat);
	rc = jx9VmThrowErrorAp(pCtx->pVm, &pCtx->pFunc->sName, iErr, zFormat, ap);
	va_end(ap);
	return rc;
}